

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifregroup(bifcxdef *ctx,int argc)

{
  long lVar1;
  runcxdef *ctx_00;
  anon_union_8_4_1dda36f5_for_runsv p_00;
  long in_RDI;
  runsdef *unaff_retaddr;
  runsdef *in_stack_00000008;
  long numval;
  uchar *p;
  runsdef val;
  ushort hplen;
  re_group_register *reg;
  size_t len;
  int grp;
  int in_stack_ffffffffffffffac;
  runcxdef *in_stack_ffffffffffffffb0;
  runsdef local_38;
  ushort local_22;
  long *local_20;
  size_t local_18;
  int local_10;
  long local_8;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\x01') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  ctx_00 = *(runcxdef **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  local_10 = (int)ctx_00;
  if ((0 < local_10) && (local_10 < 0xb)) {
    local_10 = local_10 + -1;
    if (local_10 < *(int *)(in_RDI + 0x104)) {
      local_20 = (long *)(in_RDI + 0x108 + (long)local_10 * 0x10);
      if ((*local_20 == 0) || (local_20[1] == 0)) {
        runpnil(ctx_00);
      }
      else {
        local_18 = local_20[1] - *local_20;
        local_22 = (short)local_18 + 0xf;
        local_8 = in_RDI;
        if ((uint)((int)*(undefined8 *)(*(long *)(in_RDI + 8) + 0x40) -
                  (int)*(undefined8 *)(*(long *)(in_RDI + 8) + 0x38)) <= (uint)local_22) {
          runhcmp((runcxdef *)val._0_8_,p._4_4_,(uint)p,(runsdef *)numval,in_stack_00000008,
                  unaff_retaddr);
        }
        local_38.runstyp = '\a';
        p_00 = (anon_union_8_4_1dda36f5_for_runsv)
               ((anon_union_8_4_1dda36f5_for_runsv *)(*(long *)(local_8 + 8) + 0x38))->runsvnum;
        local_38.runsv = p_00;
        oswp2(p_00.runsvstr,(uint)local_22);
        *(undefined1 *)(p_00.runsvnum + 2) = 1;
        oswp4s((void *)(p_00.runsvnum + 3),(*local_20 - *(long *)(local_8 + 0x1a8)) + 1);
        *(undefined1 *)(p_00.runsvnum + 7) = 1;
        oswp4s((void *)(p_00.runsvnum + 8),local_20[1] - *local_20);
        *(undefined1 *)(p_00.runsvnum + 0xc) = 3;
        oswp2((void *)(p_00.runsvnum + 0xd),(int)local_18 + 2);
        memcpy((void *)(p_00.runsvnum + 0xf),(void *)*local_20,local_18);
        *(long *)(*(long *)(local_8 + 8) + 0x38) =
             *(long *)(*(long *)(local_8 + 8) + 0x38) + (long)(int)(uint)local_22;
        runrepush(*(runcxdef **)(local_8 + 8),&local_38);
      }
    }
    else {
      runpnil(ctx_00);
    }
    return;
  }
  *(char **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x18) = "reGetGroup";
  *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 1;
  runsign(ctx_00,in_stack_ffffffffffffffac);
}

Assistant:

void bifregroup(bifcxdef *ctx, int argc)
{
    int grp;
    size_t len;
    re_group_register *reg;
    ushort hplen;
    runsdef val;
    uchar *p;
    long numval;
    
    /* this function takes one parameter: the group number to retrieve */
    bifcntargs(ctx, 1, argc);

    /* get the group number */
    grp = (int)runpopnum(ctx->bifcxrun);

    /* make sure it's within range */
    if (grp < 1 || grp > RE_GROUP_REG_CNT)
        runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "reGetGroup");

    /* adjust from a 1-bias to an array index */
    --grp;

    /* if the group was never set, return nil */
    if (grp >= ctx->bifcxregex.cur_group)
    {
        runpnil(ctx->bifcxrun);
        return;
    }

    /* get the register */
    reg = &ctx->bifcxregex.regs[grp];

    /* if the group wasn't set, return nil */
    if (reg->start_ofs == 0 || reg->end_ofs == 0)
    {
        runpnil(ctx->bifcxrun);
        return;
    }

    /* calculate the length of the string in this group */
    len = reg->end_ofs - reg->start_ofs;

    /* 
     *   reserve the necessary heap space: two bytes for the list length
     *   prefix, two number elements (one byte each for the type, four
     *   bytes each for the value), and the string element (one byte for
     *   the type, two bytes for the length prefix, plus the string
     *   itself).  
     */
    hplen = (ushort)(2 + 2*(1+4) + (1 + 2 + len));
    runhres(ctx->bifcxrun, hplen, 0);

    /* set up the stack value */
    val.runstyp = DAT_LIST;
    p = val.runsv.runsvstr = ctx->bifcxrun->runcxhp;

    /* put in the list length prefix */
    oswp2(p, hplen);
    p += 2;

    /* add the starting character position of the group - adjust to 1-bias */
    *p++ = DAT_NUMBER;
    numval = (long)(reg->start_ofs - ctx->bifcxregex.strbuf) + 1;
    oswp4s(p, numval);
    p += 4;

    /* add the length of the group */
    *p++ = DAT_NUMBER;
    numval = (long)(reg->end_ofs - reg->start_ofs);
    oswp4s(p, numval);
    p += 4;

    /* set up the string */
    *p++ = DAT_SSTRING;
    oswp2(p, len+2);
    p += 2;
    memcpy(p, reg->start_ofs, len);

    /* consume the heap space */
    ctx->bifcxrun->runcxhp += hplen;

    /* push the result */
    runrepush(ctx->bifcxrun, &val);
}